

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000016da20 = 0x2d2d2d2d2d2d2d;
    uRam000000000016da27._0_1_ = '-';
    uRam000000000016da27._1_1_ = '-';
    uRam000000000016da27._2_1_ = '-';
    uRam000000000016da27._3_1_ = '-';
    uRam000000000016da27._4_1_ = '-';
    uRam000000000016da27._5_1_ = '-';
    uRam000000000016da27._6_1_ = '-';
    uRam000000000016da27._7_1_ = '-';
    DAT_0016da10 = '-';
    DAT_0016da10_1._0_1_ = '-';
    DAT_0016da10_1._1_1_ = '-';
    DAT_0016da10_1._2_1_ = '-';
    DAT_0016da10_1._3_1_ = '-';
    DAT_0016da10_1._4_1_ = '-';
    DAT_0016da10_1._5_1_ = '-';
    DAT_0016da10_1._6_1_ = '-';
    uRam000000000016da18 = 0x2d2d2d2d2d2d2d;
    DAT_0016da1f = 0x2d;
    DAT_0016da00 = '-';
    DAT_0016da00_1._0_1_ = '-';
    DAT_0016da00_1._1_1_ = '-';
    DAT_0016da00_1._2_1_ = '-';
    DAT_0016da00_1._3_1_ = '-';
    DAT_0016da00_1._4_1_ = '-';
    DAT_0016da00_1._5_1_ = '-';
    DAT_0016da00_1._6_1_ = '-';
    uRam000000000016da08._0_1_ = '-';
    uRam000000000016da08._1_1_ = '-';
    uRam000000000016da08._2_1_ = '-';
    uRam000000000016da08._3_1_ = '-';
    uRam000000000016da08._4_1_ = '-';
    uRam000000000016da08._5_1_ = '-';
    uRam000000000016da08._6_1_ = '-';
    uRam000000000016da08._7_1_ = '-';
    DAT_0016d9f0 = '-';
    DAT_0016d9f0_1._0_1_ = '-';
    DAT_0016d9f0_1._1_1_ = '-';
    DAT_0016d9f0_1._2_1_ = '-';
    DAT_0016d9f0_1._3_1_ = '-';
    DAT_0016d9f0_1._4_1_ = '-';
    DAT_0016d9f0_1._5_1_ = '-';
    DAT_0016d9f0_1._6_1_ = '-';
    uRam000000000016d9f8._0_1_ = '-';
    uRam000000000016d9f8._1_1_ = '-';
    uRam000000000016d9f8._2_1_ = '-';
    uRam000000000016d9f8._3_1_ = '-';
    uRam000000000016d9f8._4_1_ = '-';
    uRam000000000016d9f8._5_1_ = '-';
    uRam000000000016d9f8._6_1_ = '-';
    uRam000000000016d9f8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000016d9e8._0_1_ = '-';
    uRam000000000016d9e8._1_1_ = '-';
    uRam000000000016d9e8._2_1_ = '-';
    uRam000000000016d9e8._3_1_ = '-';
    uRam000000000016d9e8._4_1_ = '-';
    uRam000000000016d9e8._5_1_ = '-';
    uRam000000000016d9e8._6_1_ = '-';
    uRam000000000016d9e8._7_1_ = '-';
    DAT_0016da2f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void printOpenHeader( std::string const& _name ) {
            stream  << getLineOfChars<'-'>() << '\n';
            {
                Colour colourGuard( Colour::Headers );
                printHeaderString( _name );
            }
        }